

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_sort(fy_node *fyn,fy_node_mapping_sort_fn key_cmp,void *arg)

{
  byte bVar1;
  int iVar2;
  fy_node_pair *pfVar3;
  int ret;
  fy_node_pair *fynpi;
  fy_node_pair *fynp;
  fy_node *fyni;
  void *arg_local;
  fy_node_mapping_sort_fn key_cmp_local;
  fy_node *fyn_local;
  
  if ((fyn != (fy_node *)0x0) && (bVar1 = fyn->field_0x34 & 3, (fyn->field_0x34 & 3) != 0)) {
    if (bVar1 == 1) {
      for (fynp = (fy_node_pair *)fy_node_list_head(&(fyn->field_12).sequence);
          fynp != (fy_node_pair *)0x0;
          fynp = (fy_node_pair *)fy_node_next(&(fyn->field_12).sequence,(fy_node *)fynp)) {
        fy_node_sort((fy_node *)fynp,key_cmp,arg);
      }
    }
    else if (bVar1 == 2) {
      iVar2 = fy_node_mapping_sort(fyn,key_cmp,arg);
      if (iVar2 != 0) {
        return iVar2;
      }
      fynpi = fy_node_pair_list_head(&(fyn->field_12).mapping);
      while (fynpi != (fy_node_pair *)0x0) {
        pfVar3 = fy_node_pair_next(&(fyn->field_12).mapping,fynpi);
        iVar2 = fy_node_sort(fynpi->key,key_cmp,arg);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = fy_node_sort(fynpi->value,key_cmp,arg);
        if (iVar2 != 0) {
          return iVar2;
        }
        fynpi->parent = fyn;
        fynpi = pfVar3;
      }
    }
  }
  return 0;
}

Assistant:

int fy_node_sort(struct fy_node *fyn, fy_node_mapping_sort_fn key_cmp, void *arg) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp, *fynpi;
    int ret;

    if (!fyn)
        return 0;

    switch (fyn->type) {
        case FYNT_SCALAR:
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni)) {

                fy_node_sort(fyni, key_cmp, arg);
            }
            break;

        case FYNT_MAPPING:
            ret = fy_node_mapping_sort(fyn, key_cmp, arg);
            if (ret)
                return ret;

            for (fynp = fy_node_pair_list_head(&fyn->mapping); fynp; fynp = fynpi) {

                fynpi = fy_node_pair_next(&fyn->mapping, fynp);

                /* the parent of the key is always NULL */
                ret = fy_node_sort(fynp->key, key_cmp, arg);
                if (ret)
                    return ret;

                ret = fy_node_sort(fynp->value, key_cmp, arg);
                if (ret)
                    return ret;

                fynp->parent = fyn;
            }
            break;
    }

    return 0;
}